

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cctest.h
# Opt level: O0

void CheckEqualsHelper(char *file,int line,char *expected_source,int expected,char *value_source,
                      int value)

{
  uint in_ECX;
  undefined8 in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  undefined8 in_R8;
  uint in_R9D;
  
  if (in_ECX != in_R9D) {
    printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",in_RDI,
           (ulong)in_ESI,in_RDX,in_R8,(ulong)in_ECX);
    abort();
  }
  return;
}

Assistant:

static inline void CheckEqualsHelper(const char* file, int line,
                                     const char* expected_source,
                                     int expected,
                                     const char* value_source,
                                     int value) {
  if (expected != value) {
    printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n"
           "#  Expected: %d\n"
           "#  Found:    %d\n",
           file, line, expected_source, value_source, expected, value);
    abort();
  }
}